

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SaveIniSettingsToDisk(char *ini_filename)

{
  ImGuiSettingsHandler *pIVar1;
  ImGuiContext *pIVar2;
  char *__ptr;
  int iVar3;
  FILE *__s;
  long lVar4;
  long lVar5;
  ImVector<char> buf;
  ImVector<char> local_38;
  
  pIVar2 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  if (ini_filename != (char *)0x0) {
    pIVar2->SettingsDirtyTimer = 0.0;
    ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)&local_38);
    if (0 < (pIVar2->SettingsHandlers).Size) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        pIVar1 = (pIVar2->SettingsHandlers).Data;
        (**(code **)((long)&pIVar1->WriteAllFn + lVar4))
                  (pIVar2,(long)&pIVar1->TypeName + lVar4,&local_38);
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x30;
      } while (lVar5 < (pIVar2->SettingsHandlers).Size);
    }
    __ptr = local_38.Data;
    if (local_38.Size < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                    ,0x4b9,"void ImVector<char>::pop_back() [T = char]");
    }
    iVar3 = local_38.Size + -1;
    local_38.Data = (char *)0x0;
    local_38.Size = 0;
    local_38.Capacity = 0;
    __s = fopen(ini_filename,"wt");
    if (__s != (FILE *)0x0) {
      fwrite(__ptr,1,(long)iVar3,__s);
      fclose(__s);
    }
    if (__ptr != (char *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(__ptr,GImAllocatorUserData);
    }
  }
  return;
}

Assistant:

static void SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    ImVector<char> buf;
    SaveIniSettingsToMemory(buf);

    FILE* f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    fwrite(buf.Data, sizeof(char), (size_t)buf.Size, f);
    fclose(f);
}